

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::~EigenDecompositionSquare
          (EigenDecompositionSquare<double,_1> *this)

{
  EigenDecomposition<double,_1> *in_RDI;
  int i;
  int local_c;
  
  in_RDI->_vptr_EigenDecomposition = (_func_int **)&PTR__EigenDecompositionSquare_001cd448;
  for (local_c = 0; local_c < in_RDI->kEigenDecompCount; local_c = local_c + 1) {
    free(in_RDI[1]._vptr_EigenDecomposition[local_c]);
    free(in_RDI[1].gEigenValues[local_c]);
    free(in_RDI->gEigenValues[local_c]);
  }
  free(in_RDI[1]._vptr_EigenDecomposition);
  free(in_RDI[1].gEigenValues);
  free(in_RDI->gEigenValues);
  free(in_RDI->matrixTmp);
  EigenDecomposition<double,_1>::~EigenDecomposition(in_RDI);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::~EigenDecompositionSquare() {

	for(int i=0; i<kEigenDecompCount; i++) {
		free(gEMatrices[i]);
		free(gIMatrices[i]);
		free(gEigenValues[i]);
	}
	free(gEMatrices);
	free(gIMatrices);
	free(gEigenValues);
	free(matrixTmp);
}